

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFNMatrix<100,_std::complex<long_double>_>::TPZFNMatrix
          (TPZFNMatrix<100,_std::complex<long_double>_> *this,int64_t row,int64_t col)

{
  TPZRegisterClassId *in_RDI;
  int64_t in_stack_00000008;
  complex<long_double> *in_stack_00000010;
  int64_t in_stack_00000018;
  int64_t in_stack_00000020;
  void **in_stack_00000028;
  TPZFMatrix<std::complex<long_double>_> *in_stack_00000030;
  TPZRegisterClassId *local_40;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFNMatrix<100,std::complex<long_double>>>(in_RDI,0x21);
  *(undefined ***)in_RDI = &PTR__TPZFNMatrix_023f96d0;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000010,in_stack_00000008);
  *(undefined ***)in_RDI = &PTR__TPZFNMatrix_023f96d0;
  local_40 = in_RDI + 0x90;
  do {
    std::complex<long_double>::complex((complex<long_double> *)local_40,(longdouble)0,(longdouble)0)
    ;
    local_40 = local_40 + 0x20;
  } while (local_40 != in_RDI + 0xd30);
  return;
}

Assistant:

inline TPZFNMatrix(int64_t row, int64_t col) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {}